

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O0

bool __thiscall
spirv_cross::Compiler::execution_is_noop(Compiler *this,SPIRBlock *from,SPIRBlock *to)

{
  bool bVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  SPIRBlock *pSVar4;
  Phi *pPVar5;
  Phi *phi;
  Phi *__end2;
  Phi *__begin2;
  SmallVector<spirv_cross::SPIRBlock::Phi,_8UL> *__range2;
  SPIRBlock *next;
  SPIRBlock *start;
  SPIRBlock *to_local;
  SPIRBlock *from_local;
  Compiler *this_local;
  
  bVar1 = execution_is_branchless(this,from,to);
  pSVar4 = from;
  if (bVar1) {
    while( true ) {
      next = pSVar4;
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(next->super_IVariant).self);
      uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(to->super_IVariant).self);
      if (uVar2 == uVar3) break;
      bVar1 = VectorView<spirv_cross::Instruction>::empty
                        (&(next->ops).super_VectorView<spirv_cross::Instruction>);
      if (!bVar1) {
        return false;
      }
      uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&next->next_block);
      pSVar4 = get<spirv_cross::SPIRBlock>(this,uVar2);
      __end2 = VectorView<spirv_cross::SPIRBlock::Phi>::begin
                         (&(pSVar4->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>);
      pPVar5 = VectorView<spirv_cross::SPIRBlock::Phi>::end
                         (&(pSVar4->phi_variables).super_VectorView<spirv_cross::SPIRBlock::Phi>);
      for (; __end2 != pPVar5; __end2 = __end2 + 1) {
        uVar2 = TypedID::operator_cast_to_unsigned_int((TypedID *)&__end2->parent);
        uVar3 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(next->super_IVariant).self);
        if (uVar2 == uVar3) {
          return false;
        }
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool Compiler::execution_is_noop(const SPIRBlock &from, const SPIRBlock &to) const
{
	if (!execution_is_branchless(from, to))
		return false;

	auto *start = &from;
	for (;;)
	{
		if (start->self == to.self)
			return true;

		if (!start->ops.empty())
			return false;

		auto &next = get<SPIRBlock>(start->next_block);
		// Flushing phi variables does not count as noop.
		for (auto &phi : next.phi_variables)
			if (phi.parent == start->self)
				return false;

		start = &next;
	}
}